

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O3

void gkc_print_summary(gkc_summary *s)

{
  double dVar1;
  size_t sVar2;
  list *plVar3;
  undefined1 auVar4 [16];
  
  sVar2 = s->nr_elems;
  dVar1 = s->epsilon;
  auVar4._8_4_ = (int)(sVar2 >> 0x20);
  auVar4._0_8_ = sVar2;
  auVar4._12_4_ = 0x45300000;
  fprintf(_stderr,
          "nr_elems: %zu, epsilon: %.02f, alloced: %lu, overfilled: %.02f, max_alloced: %lu\n",dVar1
          ,((auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * (dVar1 + dVar1),sVar2,
          s->alloced,s->max_alloced);
  plVar3 = (s->head).next;
  if (plVar3 == &s->head) {
    fwrite("Empty summary\n",0xe,1,_stderr);
    return;
  }
  do {
    fprintf(_stderr,"(v: %lu, g: %.02f, d: %lu) ",plVar3[-1].prev,plVar3[-2].next,plVar3[-1].next);
    plVar3 = plVar3->next;
  } while (plVar3 != &s->head);
  fputc(10,_stderr);
  return;
}

Assistant:

void gkc_print_summary(struct gkc_summary *s)
{
    struct gkc_tuple *tcur;
    struct list *cur;

    fprintf(stderr, "nr_elems: %zu, epsilon: %.02f, alloced: %" PRIu64 ", overfilled: %.02f, max_alloced: %" PRIu64 "\n",
            s->nr_elems, s->epsilon, s->alloced, 2 * s->epsilon * s->nr_elems, s->max_alloced);
    if (list_empty(&s->head)) {
        fprintf(stderr, "Empty summary\n");
        return;
    }

    cur = s->head.next;
    while (cur != &s->head) {
        tcur = list_to_tuple(cur);
        fprintf(stderr, "(v: %" PRIu64 ", g: %.02f, d: %" PRIu64 ") ", tcur->value, tcur->g, tcur->delta);
        cur = cur->next;
    }
    fprintf(stderr, "\n");
}